

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O0

void TestBignumDtoaGayPrecision(void)

{
  char *pcVar1;
  Vector<char> representation;
  int iVar2;
  PrecomputedPrecision *pPVar3;
  Vector<const_double_conversion::PrecomputedPrecision> VVar4;
  int number_digits;
  double v;
  PrecomputedPrecision current_test;
  int i;
  Vector<const_double_conversion::PrecomputedPrecision> precomputed;
  int point;
  int length;
  Vector<char> buffer;
  char buffer_container [100];
  int *in_stack_000007c0;
  int *in_stack_000007c8;
  int in_stack_000007d0;
  BignumDtoaMode in_stack_000007d4;
  double in_stack_000007d8;
  Vector<char> in_stack_000007e0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int iVar5;
  char *in_stack_ffffffffffffff08;
  int expected;
  char *in_stack_ffffffffffffff10;
  char *pcVar6;
  char *file;
  int local_a4;
  Vector<const_double_conversion::PrecomputedPrecision> local_90;
  undefined1 local_78 [16];
  char local_68 [104];
  
  double_conversion::Vector<char>::Vector((Vector<char> *)local_78,local_68,100);
  VVar4 = double_conversion::PrecomputedPrecisionRepresentations();
  local_90.start_ = VVar4.start_;
  local_90.length_ = VVar4.length_;
  local_a4 = 0;
  while( true ) {
    expected = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    iVar5 = local_a4;
    iVar2 = double_conversion::Vector<const_double_conversion::PrecomputedPrecision>::length
                      (&local_90);
    if (iVar2 <= iVar5) break;
    pPVar3 = double_conversion::Vector<const_double_conversion::PrecomputedPrecision>::operator[]
                       (&local_90,local_a4);
    pcVar1 = pPVar3->representation;
    pcVar6 = (char *)local_78._0_8_;
    file = (char *)local_78._8_8_;
    double_conversion::BignumDtoa
              (in_stack_000007d8,in_stack_000007d4,in_stack_000007d0,in_stack_000007e0,
               in_stack_000007c8,in_stack_000007c0);
    iVar2 = (int)((ulong)pcVar6 >> 0x20);
    CheckEqualsHelper(file,iVar2,in_stack_ffffffffffffff10,expected,
                      (char *)CONCAT44(iVar5,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc);
    CheckHelper(in_stack_ffffffffffffff10,expected,(char *)CONCAT44(iVar5,in_stack_ffffffffffffff00)
                ,SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
    representation.start_._4_4_ = in_stack_fffffffffffffefc;
    representation.start_._0_4_ = in_stack_fffffffffffffef8;
    representation.length_ = in_stack_ffffffffffffff00;
    representation._12_4_ = iVar5;
    in_stack_ffffffffffffff08 = (char *)local_78._0_8_;
    in_stack_ffffffffffffff10 = (char *)local_78._8_8_;
    TrimRepresentation(representation);
    in_stack_fffffffffffffef8 = SUB84(pcVar1,0);
    in_stack_fffffffffffffefc = (int)((ulong)pcVar1 >> 0x20);
    double_conversion::Vector<char>::start((Vector<char> *)local_78);
    CheckEqualsHelper(file,iVar2,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                      (char *)CONCAT44(iVar5,in_stack_ffffffffffffff00),
                      (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_a4 = local_a4 + 1;
  }
  return;
}

Assistant:

TEST(BignumDtoaGayPrecision) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  Vector<const PrecomputedPrecision> precomputed =
      PrecomputedPrecisionRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedPrecision current_test = precomputed[i];
    double v = current_test.v;
    int number_digits = current_test.number_digits;
    BignumDtoa(v, BIGNUM_DTOA_PRECISION, number_digits,
               buffer, &length, &point);
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_GE(number_digits, length);
    TrimRepresentation(buffer);
    CHECK_EQ(current_test.representation, buffer.start());
  }
}